

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  undefined1 auVar5 [16];
  
  Vector::zero(x);
  for (puVar4 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish, puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar4);
  }
  lVar2 = (long)puVar1 -
          (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar3 = lVar2 >> 2;
  auVar5._8_4_ = (int)(lVar2 >> 0x22);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  Vector::mul(x,(float)(1.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))));
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}